

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.cpp
# Opt level: O3

void __thiscall CMU462::DynamicScene::Mesh::erase_selected_element(Mesh *this)

{
  Scene *pSVar1;
  HalfedgeElement *pHVar2;
  XFormWidget *pXVar3;
  long lVar4;
  long lVar5;
  FaceIter FVar6;
  undefined8 in_R8;
  undefined8 in_R9;
  
  pSVar1 = (this->super_SceneObject).scene;
  if ((pSVar1 != (Scene *)0x0) &&
     (pHVar2 = (pSVar1->selected).element, pHVar2 != (HalfedgeElement *)0x0)) {
    lVar4 = __dynamic_cast(pHVar2,&HalfedgeElement::typeinfo,&Vertex::typeinfo,0,in_R8,in_R9,pSVar1)
    ;
    lVar5 = __dynamic_cast(pHVar2,&HalfedgeElement::typeinfo,&Edge::typeinfo,0);
    if (lVar5 == 0) {
      if (lVar4 == 0) {
        return;
      }
      FVar6 = HalfedgeMesh::eraseVertex
                        (&this->mesh,*(_List_node_base **)(*(long *)(lVar4 + 0xe8) + 0x28));
    }
    else {
      FVar6 = HalfedgeMesh::eraseEdge
                        (&this->mesh,*(_List_node_base **)(*(long *)(lVar5 + 0x58) + 0x30));
    }
    pSVar1 = (this->super_SceneObject).scene;
    (pSVar1->selected).coordinates.z = 0.0;
    (pSVar1->selected).coordinates.x = 0.0;
    (pSVar1->selected).coordinates.y = 0.0;
    (pSVar1->selected).object = (SceneObject *)0x0;
    (pSVar1->selected).element = (HalfedgeElement *)0x0;
    (pSVar1->selected).axis = None;
    pSVar1 = (this->super_SceneObject).scene;
    (pSVar1->selected).object = &this->super_SceneObject;
    (pSVar1->selected).element = (HalfedgeElement *)(FVar6._M_node + 1);
    (pSVar1->hovered).object = (SceneObject *)0x0;
    (pSVar1->hovered).element = (HalfedgeElement *)0x0;
    (pSVar1->hovered).coordinates.x = 0.0;
    (pSVar1->hovered).coordinates.y = 0.0;
    (pSVar1->hovered).coordinates.z = 0.0;
    (pSVar1->hovered).axis = None;
    pXVar3 = ((this->super_SceneObject).scene)->elementTransform;
    (pXVar3->target).coordinates.z = 0.0;
    (pXVar3->target).coordinates.x = 0.0;
    (pXVar3->target).coordinates.y = 0.0;
    (pXVar3->target).object = (SceneObject *)0x0;
    (pXVar3->target).element = (HalfedgeElement *)0x0;
    (pXVar3->target).axis = None;
  }
  return;
}

Assistant:

void Mesh::erase_selected_element() {
   if( scene == nullptr ) return;
   HalfedgeElement *element = scene->selected.element;
   if (element == nullptr) return;
   Vertex* vertex = element->getVertex();
   Edge* edge = element->getEdge();
   FaceIter f;
   if (edge != nullptr)
   {
      f = mesh.eraseEdge(edge->halfedge()->edge());
   }
   else if( vertex != nullptr )
   {
      f = mesh.eraseVertex(vertex->halfedge()->vertex());
   }
   else
   {
      return;
   }
   scene->selected.clear();
   scene->selected.object = this;
   scene->selected.element = elementAddress( f );
   scene->hovered.clear();
   scene->elementTransform->target.clear();
}